

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall test_app::test_keywords(test_app *this)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  streamable sStack_348;
  ostringstream oss;
  streamable local_1b0;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar2 = (ostream *)cppcms::application::mapper();
  cppcms::url_mapper::map(poVar2,(char *)&ss);
  value((string *)&oss,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/en");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x23c);
    std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/en\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable((streamable *)&oss,"ru");
  cppcms::url_mapper::map(poVar2,(char *)&ss,(streamable *)"/foobar/bee/bylang;lang");
  cppcms::filters::streamable::~streamable((streamable *)&oss);
  value((string *)&oss,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/ru");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x23e);
    std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/ru\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable((streamable *)&oss,"ru");
  cppcms::url_mapper::map(poVar2,(char *)&ss,(streamable *)"/foobar/bee/byloc;lang");
  cppcms::filters::streamable::~streamable((streamable *)&oss);
  value((string *)&oss,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/ru_US");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x240);
    std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/ru_US\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable((streamable *)&oss,"ru");
  cppcms::filters::streamable::streamable(&sStack_348,"RU");
  cppcms::url_mapper::map
            (poVar2,(char *)&ss,(streamable *)"/foobar/bee/byloc;lang,terr",(streamable *)&oss);
  cppcms::filters::streamable::~streamable(&sStack_348);
  cppcms::filters::streamable::~streamable((streamable *)&oss);
  value((string *)&oss,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/ru_RU");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x242);
    std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/ru_RU\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable((streamable *)&oss,"RU");
  cppcms::url_mapper::map(poVar2,(char *)&ss,(streamable *)"/foobar/bee/byloc;terr");
  cppcms::filters::streamable::~streamable((streamable *)&oss);
  value((string *)&oss,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/en_RU");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x244);
    std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/en_RU\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable((streamable *)&oss,"UA");
  cppcms::filters::streamable::streamable(&sStack_348,"ru");
  cppcms::url_mapper::map
            (poVar2,(char *)&ss,(streamable *)"/foobar/bee/byloc;terr,lang",(streamable *)&oss);
  cppcms::filters::streamable::~streamable(&sStack_348);
  cppcms::filters::streamable::~streamable((streamable *)&oss);
  value((string *)&oss,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/ru_UA");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x246);
    std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/ru_UA\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable((streamable *)&oss,"ru");
  cppcms::filters::streamable::streamable(&sStack_348,"foo");
  cppcms::url_mapper::map
            (poVar2,(char *)&ss,(streamable *)"/foobar/bee/byloc;lang",(streamable *)&oss);
  cppcms::filters::streamable::~streamable(&sStack_348);
  cppcms::filters::streamable::~streamable((streamable *)&oss);
  value((string *)&oss,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/ru_US/foo");
  std::__cxx11::string::~string((string *)&oss);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x248);
    std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/ru_US/foo\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar2 = (ostream *)cppcms::application::mapper();
  cppcms::filters::streamable::streamable((streamable *)&oss,"ru");
  cppcms::filters::streamable::streamable(&sStack_348,"RU");
  cppcms::filters::streamable::streamable(&local_1b0,"foo");
  cppcms::url_mapper::map
            (poVar2,(char *)&ss,(streamable *)"/foobar/bee/byloc;lang,terr",(streamable *)&oss,
             &sStack_348);
  cppcms::filters::streamable::~streamable(&local_1b0);
  cppcms::filters::streamable::~streamable(&sStack_348);
  cppcms::filters::streamable::~streamable((streamable *)&oss);
  value((string *)&oss,&ss);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          "xx/foobar/bee/ru_RU/foo");
  std::__cxx11::string::~string((string *)&oss);
  if (bVar1) {
    poVar2 = (ostream *)cppcms::application::mapper();
    cppcms::filters::streamable::streamable((streamable *)&oss,"RU");
    cppcms::filters::streamable::streamable(&sStack_348,"foo");
    cppcms::url_mapper::map
              (poVar2,(char *)&ss,(streamable *)"/foobar/bee/byloc;terr",(streamable *)&oss);
    cppcms::filters::streamable::~streamable(&sStack_348);
    cppcms::filters::streamable::~streamable((streamable *)&oss);
    value((string *)&oss,&ss);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/foobar/bee/en_RU/foo");
    std::__cxx11::string::~string((string *)&oss);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x24c);
      std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/en_RU/foo\"");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar2 = (ostream *)cppcms::application::mapper();
    cppcms::filters::streamable::streamable((streamable *)&oss,"UA");
    cppcms::filters::streamable::streamable(&sStack_348,"ru");
    cppcms::filters::streamable::streamable(&local_1b0,"foo");
    cppcms::url_mapper::map
              (poVar2,(char *)&ss,(streamable *)"/foobar/bee/byloc;terr,lang",(streamable *)&oss,
               &sStack_348);
    cppcms::filters::streamable::~streamable(&local_1b0);
    cppcms::filters::streamable::~streamable(&sStack_348);
    cppcms::filters::streamable::~streamable((streamable *)&oss);
    value((string *)&oss,&ss);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,"xx/foobar/bee/ru_UA/foo");
    std::__cxx11::string::~string((string *)&oss);
    if (bVar1) {
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar2 = std::operator<<((ostream *)&oss,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x24e);
    std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/ru_UA/foo\"");
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/url_mapper_test.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x24a);
  std::operator<<(poVar2," value(ss)==\"xx/foobar/bee/ru_RU/foo\"");
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,(string *)&sStack_348);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_keywords()
	{
		std::ostringstream ss;
		mapper().map(ss,"/foobar/bee/bylang");
		TEST(value(ss)=="xx/foobar/bee/en");
		mapper().map(ss,"/foobar/bee/bylang;lang","ru");
		TEST(value(ss)=="xx/foobar/bee/ru");
		mapper().map(ss,"/foobar/bee/byloc;lang","ru");
		TEST(value(ss)=="xx/foobar/bee/ru_US");
		mapper().map(ss,"/foobar/bee/byloc;lang,terr","ru","RU");
		TEST(value(ss)=="xx/foobar/bee/ru_RU");
		mapper().map(ss,"/foobar/bee/byloc;terr","RU");
		TEST(value(ss)=="xx/foobar/bee/en_RU");
		mapper().map(ss,"/foobar/bee/byloc;terr,lang","UA","ru");
		TEST(value(ss)=="xx/foobar/bee/ru_UA");
		mapper().map(ss,"/foobar/bee/byloc;lang","ru","foo");
		TEST(value(ss)=="xx/foobar/bee/ru_US/foo");
		mapper().map(ss,"/foobar/bee/byloc;lang,terr","ru","RU","foo");
		TEST(value(ss)=="xx/foobar/bee/ru_RU/foo");
		mapper().map(ss,"/foobar/bee/byloc;terr","RU","foo");
		TEST(value(ss)=="xx/foobar/bee/en_RU/foo");
		mapper().map(ss,"/foobar/bee/byloc;terr,lang","UA","ru","foo");
		TEST(value(ss)=="xx/foobar/bee/ru_UA/foo");
	}